

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O3

bool __thiscall wasm::DataFlow::Node::operator==(Node *this,Node *other)

{
  pointer ppNVar1;
  bool bVar2;
  bool bVar3;
  pointer ppNVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this->type != other->type) {
    return false;
  }
  switch(this->type) {
  case Var:
  case Block:
    return this == other;
  case Expr:
    bVar3 = ExpressionAnalyzer::equal((this->field_1).expr,(other->field_1).expr);
    if (bVar3) break;
    goto LAB_0082a901;
  case Cond:
    if ((this->field_1).index != (other->field_1).index) goto LAB_0082a901;
  }
  ppNVar4 = (this->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (this->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((long)ppNVar1 - (long)ppNVar4 ==
      (long)(other->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(other->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    if (ppNVar1 == ppNVar4) {
      bVar3 = true;
    }
    else {
      uVar5 = 0;
      uVar6 = 1;
      do {
        bVar3 = operator==(ppNVar4[uVar5],
                           (other->values).
                           super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar5]);
        if (!bVar3) {
          return bVar3;
        }
        ppNVar4 = (this->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar6 < (ulong)((long)(this->values).
                                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4 >>
                               3);
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
  }
  else {
LAB_0082a901:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const Node& other) {
    if (type != other.type) {
      return false;
    }
    switch (type) {
      case Var:
      case Block:
        return this == &other;
      case Expr: {
        if (!ExpressionAnalyzer::equal(expr, other.expr)) {
          return false;
        }
        break;
      }
      case Cond: {
        if (index != other.index) {
          return false;
        }
        break;
      }
      default: {}
    }
    if (values.size() != other.values.size()) {
      return false;
    }
    for (Index i = 0; i < values.size(); i++) {
      if (*(values[i]) != *(other.values[i])) {
        return false;
      }
    }
    return true;
  }